

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,DataRate *datarate)

{
  DataRate DVar1;
  char *pcVar2;
  char *pcVar3;
  
  DVar1 = *datarate;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)DVar1 < 500000) {
    if (DVar1 == _250K) {
      pcVar3 = "250Kbps";
      pcVar2 = "";
      goto LAB_001600d2;
    }
    if (DVar1 == _300K) {
      pcVar3 = "300Kbps";
      pcVar2 = "";
      goto LAB_001600d2;
    }
  }
  else {
    if (DVar1 == _500K) {
      pcVar3 = "500Kbps";
      pcVar2 = "";
      goto LAB_001600d2;
    }
    if (DVar1 == _1M) {
      pcVar3 = "1Mbps";
      pcVar2 = "";
      goto LAB_001600d2;
    }
  }
  pcVar3 = "Unknown";
  pcVar2 = "";
LAB_001600d2:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DataRate& datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return "250Kbps";       break;
    case DataRate::_300K:   return "300Kbps";       break;
    case DataRate::_500K:   return "500Kbps";       break;
    case DataRate::_1M:     return "1Mbps";         break;
    case DataRate::Unknown: break;
    }
    return "Unknown";
}